

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UEnumeration * ures_getKeywordValues_63(char *path,char *keyword,UErrorCode *status)

{
  int iVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  size_t sVar4;
  UEnumeration *pUVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int local_1a10;
  UErrorCode subStatus;
  ulong local_1a08;
  UEnumeration *local_1a00;
  int local_19f4;
  UErrorCode *local_19f0;
  char *local_19e8;
  UResourceBundle *local_19e0;
  char *local_19d8;
  int32_t locLen;
  UResourceBundle subItem;
  UResourceBundle item;
  char valuesBuf [2048];
  char *valuesList [512];
  
  memset(&item,0,200);
  memset(&subItem,0,200);
  local_1a00 = ures_openAvailableLocales_63(path,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_1a08 = 0;
    valuesBuf[0] = '\0';
    valuesBuf[1] = '\0';
    local_1a10 = 0;
    local_19f0 = status;
    local_19e8 = path;
    local_19d8 = keyword;
LAB_001bfe50:
    pcVar2 = uenum_next_63(local_1a00,&locLen,status);
    if (pcVar2 != (char *)0x0) {
      subStatus = U_ZERO_ERROR;
      pUVar3 = ures_openDirect_63(path,pcVar2,&subStatus);
      ures_getByKey_63(pUVar3,local_19d8,&item,&subStatus);
      if ((pUVar3 != (UResourceBundle *)0x0) && (subStatus < U_ILLEGAL_ARGUMENT_ERROR)) {
LAB_001bfeab:
        local_19e0 = pUVar3;
        uVar7 = 0;
        if (0 < (int)local_1a08) {
          uVar7 = local_1a08 & 0xffffffff;
        }
        do {
          pUVar3 = ures_getNextResource_63(&item,&subItem,&subStatus);
          if ((pUVar3 == (UResourceBundle *)0x0) || (U_ZERO_ERROR < subStatus)) {
            ures_close_63(local_19e0);
            path = local_19e8;
            status = local_19f0;
            goto LAB_001bfe50;
          }
          pcVar2 = pUVar3->fKey;
          if ((((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) &&
              (iVar1 = strcmp(pcVar2,"default"), iVar1 != 0)) &&
             (iVar1 = strncmp(pcVar2,"private-",8), iVar1 != 0)) {
            uVar8 = 0;
            do {
              if (uVar7 == uVar8) {
                if ((int)local_1a08 < 0x1ff) {
                  sVar4 = strlen(pcVar2);
                  iVar1 = (int)sVar4 + local_1a10;
                  if (iVar1 < 0x7fe) {
                    local_19f4 = iVar1 + 1;
                    strcpy(valuesBuf + local_1a10,pcVar2);
                    iVar6 = (int)local_1a08;
                    local_1a08 = (ulong)(iVar6 + 1);
                    valuesList[iVar6] = valuesBuf + local_1a10;
                    valuesBuf[iVar1] = '\0';
                    local_1a10 = local_19f4;
                    pUVar3 = local_19e0;
                    goto LAB_001bfeab;
                  }
                }
                *local_19f0 = U_ILLEGAL_ARGUMENT_ERROR;
                break;
              }
              iVar1 = strcmp(valuesList[uVar8],pcVar2);
              uVar8 = uVar8 + 1;
            } while (iVar1 != 0);
          }
        } while( true );
      }
      ures_close_63(pUVar3);
      goto LAB_001bfe50;
    }
    valuesBuf[local_1a10] = '\0';
    ures_close_63(&item);
    ures_close_63(&subItem);
    uenum_close_63(local_1a00);
    pUVar5 = uloc_openKeywordList_63(valuesBuf,local_1a10 + 1,status);
  }
  else {
    ures_close_63(&item);
    ures_close_63(&subItem);
    pUVar5 = (UEnumeration *)0x0;
  }
  return pUVar5;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ures_getKeywordValues(const char *path, const char *keyword, UErrorCode *status)
{
#define VALUES_BUF_SIZE 2048
#define VALUES_LIST_SIZE 512
    
    char       valuesBuf[VALUES_BUF_SIZE];
    int32_t    valuesIndex = 0;
    const char *valuesList[VALUES_LIST_SIZE];
    int32_t    valuesCount = 0;
    
    const char *locale;
    int32_t     locLen;
    
    UEnumeration *locs = NULL;
    
    UResourceBundle    item;
    UResourceBundle    subItem;
    
    ures_initStackObject(&item);
    ures_initStackObject(&subItem);
    locs = ures_openAvailableLocales(path, status);
    
    if(U_FAILURE(*status)) {
        ures_close(&item);
        ures_close(&subItem);
        return NULL;
    }
    
    valuesBuf[0]=0;
    valuesBuf[1]=0;
    
    while((locale = uenum_next(locs, &locLen, status)) != 0) {
        UResourceBundle   *bund = NULL;
        UResourceBundle   *subPtr = NULL;
        UErrorCode subStatus = U_ZERO_ERROR; /* don't fail if a bundle is unopenable */
        bund = ures_openDirect(path, locale, &subStatus);
        
#if defined(URES_TREE_DEBUG)
        if(!bund || U_FAILURE(subStatus)) {
            fprintf(stderr, "%s-%s values: Can't open %s locale - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
        }
#endif
        
        ures_getByKey(bund, keyword, &item, &subStatus);
        
        if(!bund || U_FAILURE(subStatus)) {
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s-%s values: Can't find in %s - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
#endif
            ures_close(bund);
            bund = NULL;
            continue;
        }
        
        while((subPtr = ures_getNextResource(&item,&subItem,&subStatus)) != 0
            && U_SUCCESS(subStatus)) {
            const char *k;
            int32_t i;
            k = ures_getKey(subPtr);

#if defined(URES_TREE_DEBUG)
            /* fprintf(stderr, "%s | %s | %s | %s\n", path?path:"<ICUDATA>", keyword, locale, k); */
#endif
            if(k == NULL || *k == 0 ||
                    uprv_strcmp(k, DEFAULT_TAG) == 0 || uprv_strncmp(k, "private-", 8) == 0) {
                // empty or "default" or unlisted type
                continue;
            }
            for(i=0; i<valuesCount; i++) {
                if(!uprv_strcmp(valuesList[i],k)) {
                    k = NULL; /* found duplicate */
                    break;
                }
            }
            if(k != NULL) {
                int32_t kLen = (int32_t)uprv_strlen(k);
                if((valuesCount >= (VALUES_LIST_SIZE-1)) ||       /* no more space in list .. */
                    ((valuesIndex+kLen+1+1) >= VALUES_BUF_SIZE)) { /* no more space in buffer (string + 2 nulls) */
                    *status = U_ILLEGAL_ARGUMENT_ERROR; /* out of space.. */
                } else {
                    uprv_strcpy(valuesBuf+valuesIndex, k);
                    valuesList[valuesCount++] = valuesBuf+valuesIndex;
                    valuesIndex += kLen;
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s | %s | %s | [%s]   (UNIQUE)\n",
                        path?path:"<ICUDATA>", keyword, locale, k);
#endif
                    valuesBuf[valuesIndex++] = 0; /* terminate */
                }
            }
        }
        ures_close(bund);
    }
    valuesBuf[valuesIndex++] = 0; /* terminate */
    
    ures_close(&item);
    ures_close(&subItem);
    uenum_close(locs);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "%s:  size %d, #%d\n", u_errorName(*status), 
        valuesIndex, valuesCount);
#endif
    return uloc_openKeywordList(valuesBuf, valuesIndex, status);
}